

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

int64_t compute_score(int wiener_win,int64_t *M,int64_t *H,int16_t *vfilt,int16_t *hfilt)

{
  short sVar1;
  int iVar2;
  int iVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  int wiener_win2;
  int plane_off;
  int l;
  int k;
  int i;
  int64_t iScore;
  int64_t Score;
  int64_t iQ;
  int64_t iP;
  int64_t Q;
  int64_t P;
  int16_t b [7];
  int16_t a [7];
  int32_t ab [49];
  int local_154;
  int local_150;
  int local_14c;
  long local_128;
  long local_120;
  short asStack_114 [7];
  short asStack_106 [7];
  int local_f8 [56];
  long local_18;
  long local_10;
  int local_4;
  
  local_120 = 0;
  local_128 = 0;
  iVar2 = 7 - in_EDI >> 1;
  iVar3 = in_EDI * in_EDI;
  asStack_114[3] = 0x80;
  asStack_106[3] = 0x80;
  for (local_14c = 0; local_14c < 3; local_14c = local_14c + 1) {
    sVar1 = *(short *)(in_RCX + (long)local_14c * 2);
    asStack_106[6 - local_14c] = sVar1;
    asStack_106[local_14c] = sVar1;
    sVar1 = *(short *)(in_R8 + (long)local_14c * 2);
    asStack_114[6 - local_14c] = sVar1;
    asStack_114[local_14c] = sVar1;
    asStack_106[3] = asStack_106[3] + asStack_106[local_14c] * -2;
    asStack_114[3] = asStack_114[3] + asStack_114[local_14c] * -2;
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  memset(local_f8,0,0xc4);
  for (local_150 = 0; local_150 < local_4; local_150 = local_150 + 1) {
    for (local_154 = 0; local_154 < local_4; local_154 = local_154 + 1) {
      local_f8[local_150 * local_4 + local_154] =
           (int)asStack_106[local_154 + iVar2] * (int)asStack_114[local_150 + iVar2];
    }
  }
  for (local_150 = 0; local_150 < iVar3; local_150 = local_150 + 1) {
    local_120 = ((long)local_f8[local_150] * *(long *)(local_10 + (long)local_150 * 8)) / 0x4000 +
                local_120;
    for (local_154 = 0; local_154 < iVar3; local_154 = local_154 + 1) {
      local_128 = ((long)local_f8[local_150] *
                   *(long *)(local_18 + (long)(local_150 * iVar3 + local_154) * 8) *
                  (long)local_f8[local_154]) / 0x10000000 + local_128;
    }
  }
  iVar2 = iVar3 >> 1;
  return (local_128 + local_120 * -2) -
         (*(long *)(local_18 + (long)(iVar2 * iVar3 + iVar2) * 8) +
         *(long *)(local_10 + (long)iVar2 * 8) * -2);
}

Assistant:

static int64_t compute_score(int wiener_win, int64_t *M, int64_t *H,
                             InterpKernel vfilt, InterpKernel hfilt) {
  int32_t ab[WIENER_WIN * WIENER_WIN];
  int16_t a[WIENER_WIN], b[WIENER_WIN];
  int64_t P = 0, Q = 0;
  int64_t iP = 0, iQ = 0;
  int64_t Score, iScore;
  int i, k, l;
  const int plane_off = (WIENER_WIN - wiener_win) >> 1;
  const int wiener_win2 = wiener_win * wiener_win;

  a[WIENER_HALFWIN] = b[WIENER_HALFWIN] = WIENER_FILT_STEP;
  for (i = 0; i < WIENER_HALFWIN; ++i) {
    a[i] = a[WIENER_WIN - i - 1] = vfilt[i];
    b[i] = b[WIENER_WIN - i - 1] = hfilt[i];
    a[WIENER_HALFWIN] -= 2 * a[i];
    b[WIENER_HALFWIN] -= 2 * b[i];
  }
  memset(ab, 0, sizeof(ab));
  for (k = 0; k < wiener_win; ++k) {
    for (l = 0; l < wiener_win; ++l)
      ab[k * wiener_win + l] = a[l + plane_off] * b[k + plane_off];
  }
  for (k = 0; k < wiener_win2; ++k) {
    P += ab[k] * M[k] / WIENER_FILT_STEP / WIENER_FILT_STEP;
    for (l = 0; l < wiener_win2; ++l) {
      Q += ab[k] * H[k * wiener_win2 + l] * ab[l] / WIENER_FILT_STEP /
           WIENER_FILT_STEP / WIENER_FILT_STEP / WIENER_FILT_STEP;
    }
  }
  Score = Q - 2 * P;

  iP = M[wiener_win2 >> 1];
  iQ = H[(wiener_win2 >> 1) * wiener_win2 + (wiener_win2 >> 1)];
  iScore = iQ - 2 * iP;

  return Score - iScore;
}